

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_sustains(textblock *tb,player_shape *s)

{
  _Bool _Var1;
  wchar_t flag;
  obj_property *poVar2;
  char **flags;
  obj_property *prop;
  wchar_t local_28;
  wchar_t i;
  wchar_t n;
  wchar_t nmax;
  char **msgs;
  player_shape *s_local;
  textblock *tb_local;
  
  _n = (char **)0x0;
  i = L'\0';
  local_28 = L'\0';
  msgs = (char **)s;
  s_local = (player_shape *)tb;
  for (prop._4_4_ = L'\0'; prop._4_4_ < L'\x05'; prop._4_4_ = prop._4_4_ + L'\x01') {
    poVar2 = lookup_obj_property(L'\x01',prop._4_4_);
    flags = msgs + 9;
    flag = sustain_flag(poVar2->index);
    _Var1 = flag_has_dbg((bitflag *)flags,6,flag,"s->flags","sustain_flag(prop->index)");
    if (_Var1) {
      shape_lore_helper_append_to_list(poVar2->name,(char ***)&n,&i,&local_28);
    }
  }
  if (L'\0' < local_28) {
    textblock_append((textblock *)s_local,"Sustains");
    shape_lore_append_list((textblock *)s_local,_n,local_28);
    textblock_append((textblock *)s_local,".\n");
    for (prop._4_4_ = L'\0'; prop._4_4_ < local_28; prop._4_4_ = prop._4_4_ + L'\x01') {
      string_free(_n[prop._4_4_]);
    }
  }
  mem_free(_n);
  return;
}

Assistant:

static void shape_lore_append_sustains(textblock *tb,
	const struct player_shape *s)
{
	const char **msgs = NULL;
	int nmax = 0, n = 0;
	int i;

	for (i = 0; i < STAT_MAX; ++i) {
		struct obj_property *prop =
			lookup_obj_property(OBJ_PROPERTY_STAT, i);

		if (of_has(s->flags, sustain_flag(prop->index))) {
			shape_lore_helper_append_to_list(
				prop->name, &msgs, &nmax, &n);
		}
	}

	if (n > 0) {
		textblock_append(tb, "Sustains");
		shape_lore_append_list(tb, msgs, n);
		textblock_append(tb, ".\n");
		for (i = 0; i < n; ++i) {
			string_free((char*) msgs[i]);
		}
	}

	mem_free(msgs);
}